

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_prim_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PrimMeta *meta,uint32_t indent)

{
  ListEditQual LVar1;
  Reference *v;
  ostream *poVar2;
  value_type_conflict *pvVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  ostream *poVar8;
  value_type *this_00;
  VariantSelectionMap *m;
  value_type *pvVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  _Rb_tree_node_base *p_Var12;
  bool v_00;
  ListEditQual v_03;
  bool v_01;
  bool v_02;
  ListEditQual v_04;
  uint32_t n;
  ListEditQual v_05;
  ListEditQual v_06;
  uint32_t n_00;
  ListEditQual v_07;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  APIName *name;
  undefined8 extraout_RDX_15;
  StringData *v_08;
  undefined8 extraout_RDX_16;
  StringData *v_09;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 uVar13;
  size_t i;
  ulong uVar14;
  uint32_t indent_00;
  long lVar15;
  undefined1 auVar16 [16];
  allocator local_3b1;
  type var;
  type vars;
  string local_360;
  stringstream ss_1;
  undefined1 local_338 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [23];
  stringstream ss;
  ostream local_1a8 [376];
  PayloadList *payload;
  
  payload = (PayloadList *)((ulong)meta & 0xffffffff);
  indent_00 = (uint32_t)meta;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar13 = extraout_RDX;
  if (*this == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)extraout_RDX);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"active = ");
    pvVar3 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)this);
    to_string_abi_cxx11_((string *)&var,(tinyusdz *)(ulong)*pvVar3,v_00);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_00;
  }
  if (this[0x178] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x178));
    ::std::__cxx11::string::string((string *)&var,"clips",(allocator *)&vars);
    indent = indent_00;
    print_customData((string *)&ss_1,pvVar4,(string *)&var,indent_00);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_01;
  }
  if (this[0x170] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"instanceable = ");
    pvVar3 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(this + 0x170));
    to_string_abi_cxx11_((string *)&var,(tinyusdz *)(ulong)*pvVar3,v_01);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_02;
  }
  if (this[2] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"hidden = ");
    pvVar3 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(this + 2));
    to_string_abi_cxx11_((string *)&var,(tinyusdz *)(ulong)*pvVar3,v_02);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_03;
  }
  if (this[4] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"kind = ");
    PrimMetas::get_kind_abi_cxx11_((string *)&vars,(PrimMetas *)this);
    ::std::__cxx11::string::string((string *)&local_360,"\"",&local_3b1);
    quote((string *)&var,(string *)&vars,&local_360);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_04;
  }
  if (this[0x2b0] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"sceneName = ");
    pvVar5 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(this + 0x2b0));
    ::std::__cxx11::string::string((string *)&vars,"\"",(allocator *)&local_360);
    quote((string *)&var,pvVar5,(string *)&vars);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_05;
  }
  if (this[0x2d8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"displayName = ");
    pvVar5 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(this + 0x2d8));
    ::std::__cxx11::string::string((string *)&vars,"\"",(allocator *)&local_360);
    quote((string *)&var,pvVar5,(string *)&vars);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_06;
  }
  if (this[0x30] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x30));
    ::std::__cxx11::string::string((string *)&var,"assetInfo",(allocator *)&vars);
    indent = indent_00;
    print_customData((string *)&ss_1,pvVar4,(string *)&var,indent_00);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_07;
  }
  if (this[0x200] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                      *)(this + 0x200));
    LVar1 = pvVar6->first;
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                      *)(this + 0x200));
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&var,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&pvVar6->second);
    if (LVar1 != ResetToExplicit) {
      to_string_abi_cxx11_((string *)&ss_1,(tinyusdz *)(ulong)LVar1,v_03);
      poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::_M_dispose();
    }
    lVar15 = (long)var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
    poVar2 = ::std::operator<<(local_1a8,"inherits = ");
    if (lVar15 == 0xd0) {
      ::std::operator<<(poVar2,var.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      ::std::operator<<(poVar2,&var);
    }
    ::std::operator<<(local_1a8,"\n");
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&var);
    uVar13 = extraout_RDX_08;
  }
  if (this[0x288] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                      *)(this + 0x288));
    LVar1 = pvVar6->first;
    pvVar6 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                      *)(this + 0x288));
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&var,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&pvVar6->second);
    if (LVar1 != ResetToExplicit) {
      to_string_abi_cxx11_((string *)&ss_1,(tinyusdz *)(ulong)LVar1,v_04);
      poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::_M_dispose();
    }
    lVar15 = (long)var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
    poVar2 = ::std::operator<<(local_1a8,"specializes = ");
    if (lVar15 == 0xd0) {
      ::std::operator<<(poVar2,var.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      ::std::operator<<(poVar2,&var);
    }
    ::std::operator<<(local_1a8,"\n");
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&var);
    uVar13 = extraout_RDX_09;
  }
  if (this[0x1b0] == (tinyusdz)0x1) {
    pvVar7 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
                      *)(this + 0x1b0));
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
    LVar1 = pvVar7->first;
    std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::vector
              ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)&vars,
               &pvVar7->second);
    poVar2 = (ostream *)(local_338 + 8);
    pprint::Indent_abi_cxx11_((string *)&var,(pprint *)payload,n);
    ::std::operator<<(poVar2,(string *)&var);
    ::std::__cxx11::string::_M_dispose();
    if (LVar1 != ResetToExplicit) {
      to_string_abi_cxx11_((string *)&var,(tinyusdz *)(ulong)LVar1,v_05);
      poVar8 = ::std::operator<<(poVar2,(string *)&var);
      ::std::operator<<(poVar8," ");
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(poVar2,"references = ");
    v = (Reference *)
        CONCAT44(vars.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 vars.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (v == vars.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
      ::std::operator<<(poVar2,"None");
    }
    else if ((long)vars.
                   super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)v == 0x150) {
      ::std::operator<<(poVar2,v);
    }
    else {
      ::std::operator<<(poVar2,&vars);
    }
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(&vars);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
    ::std::operator<<(local_1a8,(string *)&var);
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_10;
  }
  if (this[0x1d8] == (tinyusdz)0x1) {
    this_00 = nonstd::optional_lite::
              optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
              ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
                       *)(this + 0x1d8));
    print_payload_abi_cxx11_((string *)&ss_1,(tinyusdz *)this_00,payload,indent);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_11;
  }
  if (this[0x138] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x138));
    ::std::__cxx11::string::string((string *)&var,"sdrMetadata",(allocator *)&vars);
    indent = indent_00;
    print_customData((string *)&ss_1,pvVar4,(string *)&var,indent_00);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_12;
  }
  if (this[0x250] == (tinyusdz)0x1) {
    m = (VariantSelectionMap *)
        nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(this + 0x250));
    print_variantSelectionMap((string *)&ss_1,m,indent_00);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_13;
  }
  if (this[0x228] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)payload,(uint32_t)uVar13);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    pvVar9 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(this + 0x228));
    LVar1 = pvVar9->first;
    pvVar9 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::value((optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(this + 0x228));
    if (LVar1 != ResetToExplicit) {
      to_string_abi_cxx11_((string *)&ss_1,(tinyusdz *)(ulong)LVar1,v_06);
      poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"variantSets = ");
    if ((pvVar9->second).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pvVar9->second).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::operator<<(local_1a8,"None");
    }
    else {
      to_string<std::__cxx11::string>
                ((string *)&ss_1,(tinyusdz *)&pvVar9->second,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,indent);
      ::std::operator<<(local_1a8,(string *)&ss_1);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    uVar13 = extraout_RDX_14;
  }
  if (this[0x110] == (tinyusdz)0x1) {
    pvVar10 = nonstd::optional_lite::optional<tinyusdz::APISchemas>::value
                        ((optional<tinyusdz::APISchemas> *)(this + 0x110));
    APISchemas::APISchemas((APISchemas *)&ss_1,pvVar10);
    if ((undefined1  [8])local_330[0]._0_8_ != local_338) {
      pprint::Indent_abi_cxx11_((string *)&var,(pprint *)payload,n_00);
      poVar2 = ::std::operator<<(local_1a8,(string *)&var);
      to_string_abi_cxx11_((string *)&vars,(tinyusdz *)(ulong)_ss_1,v_07);
      poVar2 = ::std::operator<<(poVar2,(string *)&vars);
      ::std::operator<<(poVar2," apiSchemas = [");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      lVar15 = 8;
      uVar14 = 0;
      while( true ) {
        if ((ulong)((local_330[0]._M_allocated_capacity - (long)local_338) / 0x28) <= uVar14) break;
        if (uVar14 != 0) {
          ::std::operator<<(local_1a8,", ");
        }
        vars.super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)((long)local_338 + lVar15 + -8);
        poVar2 = ::std::operator<<(local_1a8,"\"");
        to_string_abi_cxx11_((string *)&var,(tinyusdz *)&vars,name);
        ::std::operator<<(poVar2,(string *)&var);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::string
                  ((string *)&var,(string *)((long)(APIName *)local_338 + lVar15));
        if (var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          poVar2 = ::std::operator<<(local_1a8,":");
          ::std::operator<<(poVar2,(string *)&var);
        }
        ::std::operator<<(local_1a8,"\"");
        ::std::__cxx11::string::_M_dispose();
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x28;
      }
      ::std::operator<<(local_1a8,"]\n");
    }
    ::std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_338);
    uVar13 = extraout_RDX_15;
  }
  if (this[0xa0] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar13)
    ;
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"doc = ");
    pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                        ((optional<tinyusdz::value::StringData> *)(this + 0xa0));
    to_string_abi_cxx11_((string *)&var,(tinyusdz *)pvVar11,v_08);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_16;
  }
  if (this[0xd8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar13)
    ;
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,"comment = ");
    pvVar11 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                        ((optional<tinyusdz::value::StringData> *)(this + 0xd8));
    to_string_abi_cxx11_((string *)&var,(tinyusdz *)pvVar11,v_09);
    poVar2 = ::std::operator<<(poVar2,(string *)&var);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_17;
  }
  if (this[0x68] == (tinyusdz)0x1) {
    pvVar4 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x68));
    ::std::__cxx11::string::string((string *)&var,"customData",(allocator *)&vars);
    print_customData((string *)&ss_1,pvVar4,(string *)&var,indent_00);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar13 = extraout_RDX_18;
  }
  auVar16._8_8_ = uVar13;
  auVar16._0_8_ = *(undefined8 *)(this + 0x318);
  while (p_Var12 = auVar16._0_8_, p_Var12 != (_Rb_tree_node_base *)(this + 0x308)) {
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)((ulong)meta & 0xffffffff),auVar16._8_4_);
    poVar2 = ::std::operator<<(local_1a8,(string *)&ss_1);
    poVar2 = ::std::operator<<(poVar2,(string *)(p_Var12 + 1));
    poVar2 = ::std::operator<<(poVar2," = ");
    poVar2 = ::std::operator<<(poVar2,(string *)(p_Var12 + 2));
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    auVar16 = ::std::_Rb_tree_increment(p_Var12);
  }
  for (p_Var12 = *(_Rb_tree_node_base **)(this + 0x348);
      p_Var12 != (_Rb_tree_node_base *)(this + 0x338);
      p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var12)) {
    print_meta((string *)&ss_1,(MetaVariable *)(p_Var12 + 2),indent_00 + 1,true,
               (string *)(p_Var12 + 1));
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_prim_metas(const PrimMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.active) {
    ss << pprint::Indent(indent)
       << "active = " << to_string(meta.active.value()) << "\n";
  }

  if (meta.clips) {
    ss << print_customData(meta.clips.value(), "clips", indent);
  }

  if (meta.instanceable) {
    ss << pprint::Indent(indent)
       << "instanceable = " << to_string(meta.instanceable.value()) << "\n";
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.kind) {
    ss << pprint::Indent(indent) << "kind = " << quote(meta.get_kind()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.sceneName) {
    ss << pprint::Indent(indent)
       << "sceneName = " << quote(meta.sceneName.value()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.assetInfo) {
    ss << print_customData(meta.assetInfo.value(), "assetInfo", indent);
  }

  if (meta.inherits) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.inherits.value());
    auto var = std::get<1>(meta.inherits.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "inherits = " << var[0];
    } else {
      ss << "inherits = " << var;
    }
    ss << "\n";
  }

  if (meta.specializes) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.specializes.value());
    auto var = std::get<1>(meta.specializes.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "specializes = " << var[0];
    } else {
      ss << "specializes = " << var;
    }
    ss << "\n";
  }

  if (meta.references) {
    ss << print_references(meta.references.value(), indent);
  }

  if (meta.payload) {
    ss << print_payload(meta.payload.value(), indent);
  }

  // TODO: only print in usdShade Prims.
  if (meta.sdrMetadata) {
    ss << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.variants) {
    ss << print_variantSelectionMap(meta.variants.value(), indent);
  }

  if (meta.variantSets) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.variantSets.value());
    const std::vector<std::string> &vs =
        std::get<1>(meta.variantSets.value());  // string[]

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    ss << "variantSets = ";

    if (vs.empty()) {
      ss << "None";
    } else {
      ss << to_string(vs);
    }

    ss << "\n";
  }

  if (meta.apiSchemas) {
    auto schemas = meta.apiSchemas.value();

    if (schemas.names.size()) {
      ss << pprint::Indent(indent) << to_string(schemas.listOpQual)
         << " apiSchemas = [";

      for (size_t i = 0; i < schemas.names.size(); i++) {
        if (i != 0) {
          ss << ", ";
        }

        auto name = std::get<0>(schemas.names[i]);
        ss << "\"" << to_string(name);

        auto instanceName = std::get<1>(schemas.names[i]);

        if (!instanceName.empty()) {
          ss << ":" << instanceName;
        }

        ss << "\"";
      }
      ss << "]\n";
    }
  }

  if (meta.doc) {
    ss << pprint::Indent(indent) << "doc = " << to_string(meta.doc.value())
       << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  for (const auto &item : meta.unregisteredMetas) {
    // do not quote
    ss << pprint::Indent(indent) << item.first << " = " << item.second << "\n";
  }

  // TODO: deprecate meta.meta and remove it.
  for (const auto &item : meta.meta) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }

  // for (const auto &item : meta.stringData) {
  //   ss << pprint::Indent(indent) << to_string(item) << "\n";
  // }

  return ss.str();
}